

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::MutablePatternModifier::MutablePatternModifier
          (MutablePatternModifier *this,bool isStrong)

{
  (this->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__MutablePatternModifier_004774f0;
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__MutablePatternModifier_00477558;
  (this->super_SymbolProvider)._vptr_SymbolProvider =
       (_func_int **)&PTR__MutablePatternModifier_004775b0;
  this->fStrong = isStrong;
  (this->currentAffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->currentAffix).fUnion.fStackFields.fLengthAndFlags = 2;
  return;
}

Assistant:

MutablePatternModifier::MutablePatternModifier(bool isStrong)
        : fStrong(isStrong) {}